

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_message_type.cpp
# Opt level: O0

void __thiscall
BrokerMessageType_EmptyString_Test::TestBody(BrokerMessageType_EmptyString_Test *this)

{
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<char,_244UL>_>_> matcher;
  bool bVar1;
  char *pcVar2;
  long lVar3;
  array<char,_244UL> *rhs;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<char,_244UL>_>_> *pPVar4;
  undefined8 *puVar5;
  byte bVar6;
  undefined8 uStackY_668;
  undefined1 in_stack_fffffffffffff9a0 [232];
  undefined4 in_stack_fffffffffffffa8c;
  undefined4 in_stack_fffffffffffffa90;
  AssertHelper local_4d0;
  Message local_4c8;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<char,_244UL>_>_> local_4c0;
  char local_3cc [244];
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_4;
  payload_type expected_payload;
  Message local_1c8;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_3;
  Message local_1a8;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_2;
  Message local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_1;
  Message local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar;
  allocator local_139;
  string local_138;
  undefined1 local_118 [8];
  message_type actual;
  uint16_t num_parts;
  uint16_t part;
  uint32_t mid;
  BrokerMessageType_EmptyString_Test *this_local;
  
  bVar6 = 0;
  actual.payload._M_elems[0xf0] = -0x2e;
  actual.payload._M_elems[0xf1] = '\x04';
  actual.payload._M_elems[0xf2] = '\0';
  actual.payload._M_elems[0xf3] = '\0';
  actual.payload._M_elems[0xee] = '\x15';
  actual.payload._M_elems[0xef] = '\0';
  actual.payload._M_elems[0xec] = -0x2e;
  actual.payload._M_elems[0xed] = '\x04';
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_138,"",&local_139);
  pstore::brokerface::message_type::message_type
            ((message_type *)local_118,0x4d2,0x15,0x4d2,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_160,"actual.sender_id","pstore::brokerface::message_type::process_id"
             ,(uint *)local_118,&pstore::brokerface::message_type::process_id);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/brokerface/test_message_type.cpp"
               ,0x32,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_180,"actual.message_id","mid",(uint *)(local_118 + 4),
             (uint *)(actual.payload._M_elems + 0xf0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/brokerface/test_message_type.cpp"
               ,0x33,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  testing::internal::EqHelper::Compare<unsigned_short,_unsigned_short,_nullptr>
            ((EqHelper *)local_1a0,"actual.part_no","part",(unsigned_short *)&actual,
             (unsigned_short *)(actual.payload._M_elems + 0xee));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/brokerface/test_message_type.cpp"
               ,0x34,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  testing::internal::EqHelper::Compare<unsigned_short,_unsigned_short,_nullptr>
            ((EqHelper *)local_1c0,"actual.num_parts","num_parts",
             (unsigned_short *)((long)&actual.sender_id + 2),
             (unsigned_short *)(actual.payload._M_elems + 0xec));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(expected_payload._M_elems + 0xf0),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/brokerface/test_message_type.cpp"
               ,0x35,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(expected_payload._M_elems + 0xf0),&local_1c8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)(expected_payload._M_elems + 0xf0));
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  expected_payload._M_elems[0xd8] = '\0';
  expected_payload._M_elems[0xd9] = '\0';
  expected_payload._M_elems[0xda] = '\0';
  expected_payload._M_elems[0xdb] = '\0';
  expected_payload._M_elems[0xdc] = '\0';
  expected_payload._M_elems[0xdd] = '\0';
  expected_payload._M_elems[0xde] = '\0';
  expected_payload._M_elems[0xdf] = '\0';
  expected_payload._M_elems[0xe0] = '\0';
  expected_payload._M_elems[0xe1] = '\0';
  expected_payload._M_elems[0xe2] = '\0';
  expected_payload._M_elems[0xe3] = '\0';
  expected_payload._M_elems[0xe4] = '\0';
  expected_payload._M_elems[0xe5] = '\0';
  expected_payload._M_elems[0xe6] = '\0';
  expected_payload._M_elems[0xe7] = '\0';
  expected_payload._M_elems[200] = '\0';
  expected_payload._M_elems[0xc9] = '\0';
  expected_payload._M_elems[0xca] = '\0';
  expected_payload._M_elems[0xcb] = '\0';
  expected_payload._M_elems[0xcc] = '\0';
  expected_payload._M_elems[0xcd] = '\0';
  expected_payload._M_elems[0xce] = '\0';
  expected_payload._M_elems[0xcf] = '\0';
  expected_payload._M_elems[0xd0] = '\0';
  expected_payload._M_elems[0xd1] = '\0';
  expected_payload._M_elems[0xd2] = '\0';
  expected_payload._M_elems[0xd3] = '\0';
  expected_payload._M_elems[0xd4] = '\0';
  expected_payload._M_elems[0xd5] = '\0';
  expected_payload._M_elems[0xd6] = '\0';
  expected_payload._M_elems[0xd7] = '\0';
  expected_payload._M_elems[0xb8] = '\0';
  expected_payload._M_elems[0xb9] = '\0';
  expected_payload._M_elems[0xba] = '\0';
  expected_payload._M_elems[0xbb] = '\0';
  expected_payload._M_elems[0xbc] = '\0';
  expected_payload._M_elems[0xbd] = '\0';
  expected_payload._M_elems[0xbe] = '\0';
  expected_payload._M_elems[0xbf] = '\0';
  expected_payload._M_elems[0xc0] = '\0';
  expected_payload._M_elems[0xc1] = '\0';
  expected_payload._M_elems[0xc2] = '\0';
  expected_payload._M_elems[0xc3] = '\0';
  expected_payload._M_elems[0xc4] = '\0';
  expected_payload._M_elems[0xc5] = '\0';
  expected_payload._M_elems[0xc6] = '\0';
  expected_payload._M_elems[199] = '\0';
  expected_payload._M_elems[0xa8] = '\0';
  expected_payload._M_elems[0xa9] = '\0';
  expected_payload._M_elems[0xaa] = '\0';
  expected_payload._M_elems[0xab] = '\0';
  expected_payload._M_elems[0xac] = '\0';
  expected_payload._M_elems[0xad] = '\0';
  expected_payload._M_elems[0xae] = '\0';
  expected_payload._M_elems[0xaf] = '\0';
  expected_payload._M_elems[0xb0] = '\0';
  expected_payload._M_elems[0xb1] = '\0';
  expected_payload._M_elems[0xb2] = '\0';
  expected_payload._M_elems[0xb3] = '\0';
  expected_payload._M_elems[0xb4] = '\0';
  expected_payload._M_elems[0xb5] = '\0';
  expected_payload._M_elems[0xb6] = '\0';
  expected_payload._M_elems[0xb7] = '\0';
  expected_payload._M_elems[0x98] = '\0';
  expected_payload._M_elems[0x99] = '\0';
  expected_payload._M_elems[0x9a] = '\0';
  expected_payload._M_elems[0x9b] = '\0';
  expected_payload._M_elems[0x9c] = '\0';
  expected_payload._M_elems[0x9d] = '\0';
  expected_payload._M_elems[0x9e] = '\0';
  expected_payload._M_elems[0x9f] = '\0';
  expected_payload._M_elems[0xa0] = '\0';
  expected_payload._M_elems[0xa1] = '\0';
  expected_payload._M_elems[0xa2] = '\0';
  expected_payload._M_elems[0xa3] = '\0';
  expected_payload._M_elems[0xa4] = '\0';
  expected_payload._M_elems[0xa5] = '\0';
  expected_payload._M_elems[0xa6] = '\0';
  expected_payload._M_elems[0xa7] = '\0';
  expected_payload._M_elems[0x88] = '\0';
  expected_payload._M_elems[0x89] = '\0';
  expected_payload._M_elems[0x8a] = '\0';
  expected_payload._M_elems[0x8b] = '\0';
  expected_payload._M_elems[0x8c] = '\0';
  expected_payload._M_elems[0x8d] = '\0';
  expected_payload._M_elems[0x8e] = '\0';
  expected_payload._M_elems[0x8f] = '\0';
  expected_payload._M_elems[0x90] = '\0';
  expected_payload._M_elems[0x91] = '\0';
  expected_payload._M_elems[0x92] = '\0';
  expected_payload._M_elems[0x93] = '\0';
  expected_payload._M_elems[0x94] = '\0';
  expected_payload._M_elems[0x95] = '\0';
  expected_payload._M_elems[0x96] = '\0';
  expected_payload._M_elems[0x97] = '\0';
  expected_payload._M_elems[0x78] = '\0';
  expected_payload._M_elems[0x79] = '\0';
  expected_payload._M_elems[0x7a] = '\0';
  expected_payload._M_elems[0x7b] = '\0';
  expected_payload._M_elems[0x7c] = '\0';
  expected_payload._M_elems[0x7d] = '\0';
  expected_payload._M_elems[0x7e] = '\0';
  expected_payload._M_elems[0x7f] = '\0';
  expected_payload._M_elems[0x80] = '\0';
  expected_payload._M_elems[0x81] = '\0';
  expected_payload._M_elems[0x82] = '\0';
  expected_payload._M_elems[0x83] = '\0';
  expected_payload._M_elems[0x84] = '\0';
  expected_payload._M_elems[0x85] = '\0';
  expected_payload._M_elems[0x86] = '\0';
  expected_payload._M_elems[0x87] = '\0';
  expected_payload._M_elems[0x68] = '\0';
  expected_payload._M_elems[0x69] = '\0';
  expected_payload._M_elems[0x6a] = '\0';
  expected_payload._M_elems[0x6b] = '\0';
  expected_payload._M_elems[0x6c] = '\0';
  expected_payload._M_elems[0x6d] = '\0';
  expected_payload._M_elems[0x6e] = '\0';
  expected_payload._M_elems[0x6f] = '\0';
  expected_payload._M_elems[0x70] = '\0';
  expected_payload._M_elems[0x71] = '\0';
  expected_payload._M_elems[0x72] = '\0';
  expected_payload._M_elems[0x73] = '\0';
  expected_payload._M_elems[0x74] = '\0';
  expected_payload._M_elems[0x75] = '\0';
  expected_payload._M_elems[0x76] = '\0';
  expected_payload._M_elems[0x77] = '\0';
  expected_payload._M_elems[0x58] = '\0';
  expected_payload._M_elems[0x59] = '\0';
  expected_payload._M_elems[0x5a] = '\0';
  expected_payload._M_elems[0x5b] = '\0';
  expected_payload._M_elems[0x5c] = '\0';
  expected_payload._M_elems[0x5d] = '\0';
  expected_payload._M_elems[0x5e] = '\0';
  expected_payload._M_elems[0x5f] = '\0';
  expected_payload._M_elems[0x60] = '\0';
  expected_payload._M_elems[0x61] = '\0';
  expected_payload._M_elems[0x62] = '\0';
  expected_payload._M_elems[99] = '\0';
  expected_payload._M_elems[100] = '\0';
  expected_payload._M_elems[0x65] = '\0';
  expected_payload._M_elems[0x66] = '\0';
  expected_payload._M_elems[0x67] = '\0';
  expected_payload._M_elems[0x48] = '\0';
  expected_payload._M_elems[0x49] = '\0';
  expected_payload._M_elems[0x4a] = '\0';
  expected_payload._M_elems[0x4b] = '\0';
  expected_payload._M_elems[0x4c] = '\0';
  expected_payload._M_elems[0x4d] = '\0';
  expected_payload._M_elems[0x4e] = '\0';
  expected_payload._M_elems[0x4f] = '\0';
  expected_payload._M_elems[0x50] = '\0';
  expected_payload._M_elems[0x51] = '\0';
  expected_payload._M_elems[0x52] = '\0';
  expected_payload._M_elems[0x53] = '\0';
  expected_payload._M_elems[0x54] = '\0';
  expected_payload._M_elems[0x55] = '\0';
  expected_payload._M_elems[0x56] = '\0';
  expected_payload._M_elems[0x57] = '\0';
  expected_payload._M_elems[0x38] = '\0';
  expected_payload._M_elems[0x39] = '\0';
  expected_payload._M_elems[0x3a] = '\0';
  expected_payload._M_elems[0x3b] = '\0';
  expected_payload._M_elems[0x3c] = '\0';
  expected_payload._M_elems[0x3d] = '\0';
  expected_payload._M_elems[0x3e] = '\0';
  expected_payload._M_elems[0x3f] = '\0';
  expected_payload._M_elems[0x40] = '\0';
  expected_payload._M_elems[0x41] = '\0';
  expected_payload._M_elems[0x42] = '\0';
  expected_payload._M_elems[0x43] = '\0';
  expected_payload._M_elems[0x44] = '\0';
  expected_payload._M_elems[0x45] = '\0';
  expected_payload._M_elems[0x46] = '\0';
  expected_payload._M_elems[0x47] = '\0';
  expected_payload._M_elems[0x28] = '\0';
  expected_payload._M_elems[0x29] = '\0';
  expected_payload._M_elems[0x2a] = '\0';
  expected_payload._M_elems[0x2b] = '\0';
  expected_payload._M_elems[0x2c] = '\0';
  expected_payload._M_elems[0x2d] = '\0';
  expected_payload._M_elems[0x2e] = '\0';
  expected_payload._M_elems[0x2f] = '\0';
  expected_payload._M_elems[0x30] = '\0';
  expected_payload._M_elems[0x31] = '\0';
  expected_payload._M_elems[0x32] = '\0';
  expected_payload._M_elems[0x33] = '\0';
  expected_payload._M_elems[0x34] = '\0';
  expected_payload._M_elems[0x35] = '\0';
  expected_payload._M_elems[0x36] = '\0';
  expected_payload._M_elems[0x37] = '\0';
  expected_payload._M_elems[0x18] = '\0';
  expected_payload._M_elems[0x19] = '\0';
  expected_payload._M_elems[0x1a] = '\0';
  expected_payload._M_elems[0x1b] = '\0';
  expected_payload._M_elems[0x1c] = '\0';
  expected_payload._M_elems[0x1d] = '\0';
  expected_payload._M_elems[0x1e] = '\0';
  expected_payload._M_elems[0x1f] = '\0';
  expected_payload._M_elems[0x20] = '\0';
  expected_payload._M_elems[0x21] = '\0';
  expected_payload._M_elems[0x22] = '\0';
  expected_payload._M_elems[0x23] = '\0';
  expected_payload._M_elems[0x24] = '\0';
  expected_payload._M_elems[0x25] = '\0';
  expected_payload._M_elems[0x26] = '\0';
  expected_payload._M_elems[0x27] = '\0';
  expected_payload._M_elems[8] = '\0';
  expected_payload._M_elems[9] = '\0';
  expected_payload._M_elems[10] = '\0';
  expected_payload._M_elems[0xb] = '\0';
  expected_payload._M_elems[0xc] = '\0';
  expected_payload._M_elems[0xd] = '\0';
  expected_payload._M_elems[0xe] = '\0';
  expected_payload._M_elems[0xf] = '\0';
  expected_payload._M_elems[0x10] = '\0';
  expected_payload._M_elems[0x11] = '\0';
  expected_payload._M_elems[0x12] = '\0';
  expected_payload._M_elems[0x13] = '\0';
  expected_payload._M_elems[0x14] = '\0';
  expected_payload._M_elems[0x15] = '\0';
  expected_payload._M_elems[0x16] = '\0';
  expected_payload._M_elems[0x17] = '\0';
  gtest_ar_4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  expected_payload._M_elems[0] = '\0';
  expected_payload._M_elems[1] = '\0';
  expected_payload._M_elems[2] = '\0';
  expected_payload._M_elems[3] = '\0';
  expected_payload._M_elems[4] = '\0';
  expected_payload._M_elems[5] = '\0';
  expected_payload._M_elems[6] = '\0';
  expected_payload._M_elems[7] = '\0';
  expected_payload._M_elems[0xe8] = '\0';
  expected_payload._M_elems[0xe9] = '\0';
  expected_payload._M_elems[0xea] = '\0';
  expected_payload._M_elems[0xeb] = '\0';
  testing::ContainerEq<std::array<char,244ul>>(&local_4c0,(testing *)&gtest_ar_4.message_,rhs);
  pPVar4 = &local_4c0;
  puVar5 = &uStackY_668;
  for (lVar3 = 0x1e; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar5 = *(undefined8 *)(pPVar4->impl_).expected_._M_elems;
    pPVar4 = (PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<char,_244UL>_>_> *
             )((long)pPVar4 + (ulong)bVar6 * -0x10 + 8);
    puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
  }
  matcher.impl_.expected_._M_elems[0xe8] = local_4c0.impl_.expected_._M_elems[0xf0];
  matcher.impl_.expected_._M_elems[0xe9] = local_4c0.impl_.expected_._M_elems[0xf1];
  matcher.impl_.expected_._M_elems[0xea] = local_4c0.impl_.expected_._M_elems[0xf2];
  matcher.impl_.expected_._M_elems[0xeb] = local_4c0.impl_.expected_._M_elems[0xf3];
  matcher.impl_.expected_._M_elems[0] = in_stack_fffffffffffff9a0[0];
  matcher.impl_.expected_._M_elems[1] = in_stack_fffffffffffff9a0[1];
  matcher.impl_.expected_._M_elems[2] = in_stack_fffffffffffff9a0[2];
  matcher.impl_.expected_._M_elems[3] = in_stack_fffffffffffff9a0[3];
  matcher.impl_.expected_._M_elems[4] = in_stack_fffffffffffff9a0[4];
  matcher.impl_.expected_._M_elems[5] = in_stack_fffffffffffff9a0[5];
  matcher.impl_.expected_._M_elems[6] = in_stack_fffffffffffff9a0[6];
  matcher.impl_.expected_._M_elems[7] = in_stack_fffffffffffff9a0[7];
  matcher.impl_.expected_._M_elems[8] = in_stack_fffffffffffff9a0[8];
  matcher.impl_.expected_._M_elems[9] = in_stack_fffffffffffff9a0[9];
  matcher.impl_.expected_._M_elems[10] = in_stack_fffffffffffff9a0[10];
  matcher.impl_.expected_._M_elems[0xb] = in_stack_fffffffffffff9a0[0xb];
  matcher.impl_.expected_._M_elems[0xc] = in_stack_fffffffffffff9a0[0xc];
  matcher.impl_.expected_._M_elems[0xd] = in_stack_fffffffffffff9a0[0xd];
  matcher.impl_.expected_._M_elems[0xe] = in_stack_fffffffffffff9a0[0xe];
  matcher.impl_.expected_._M_elems[0xf] = in_stack_fffffffffffff9a0[0xf];
  matcher.impl_.expected_._M_elems[0x10] = in_stack_fffffffffffff9a0[0x10];
  matcher.impl_.expected_._M_elems[0x11] = in_stack_fffffffffffff9a0[0x11];
  matcher.impl_.expected_._M_elems[0x12] = in_stack_fffffffffffff9a0[0x12];
  matcher.impl_.expected_._M_elems[0x13] = in_stack_fffffffffffff9a0[0x13];
  matcher.impl_.expected_._M_elems[0x14] = in_stack_fffffffffffff9a0[0x14];
  matcher.impl_.expected_._M_elems[0x15] = in_stack_fffffffffffff9a0[0x15];
  matcher.impl_.expected_._M_elems[0x16] = in_stack_fffffffffffff9a0[0x16];
  matcher.impl_.expected_._M_elems[0x17] = in_stack_fffffffffffff9a0[0x17];
  matcher.impl_.expected_._M_elems[0x18] = in_stack_fffffffffffff9a0[0x18];
  matcher.impl_.expected_._M_elems[0x19] = in_stack_fffffffffffff9a0[0x19];
  matcher.impl_.expected_._M_elems[0x1a] = in_stack_fffffffffffff9a0[0x1a];
  matcher.impl_.expected_._M_elems[0x1b] = in_stack_fffffffffffff9a0[0x1b];
  matcher.impl_.expected_._M_elems[0x1c] = in_stack_fffffffffffff9a0[0x1c];
  matcher.impl_.expected_._M_elems[0x1d] = in_stack_fffffffffffff9a0[0x1d];
  matcher.impl_.expected_._M_elems[0x1e] = in_stack_fffffffffffff9a0[0x1e];
  matcher.impl_.expected_._M_elems[0x1f] = in_stack_fffffffffffff9a0[0x1f];
  matcher.impl_.expected_._M_elems[0x20] = in_stack_fffffffffffff9a0[0x20];
  matcher.impl_.expected_._M_elems[0x21] = in_stack_fffffffffffff9a0[0x21];
  matcher.impl_.expected_._M_elems[0x22] = in_stack_fffffffffffff9a0[0x22];
  matcher.impl_.expected_._M_elems[0x23] = in_stack_fffffffffffff9a0[0x23];
  matcher.impl_.expected_._M_elems[0x24] = in_stack_fffffffffffff9a0[0x24];
  matcher.impl_.expected_._M_elems[0x25] = in_stack_fffffffffffff9a0[0x25];
  matcher.impl_.expected_._M_elems[0x26] = in_stack_fffffffffffff9a0[0x26];
  matcher.impl_.expected_._M_elems[0x27] = in_stack_fffffffffffff9a0[0x27];
  matcher.impl_.expected_._M_elems[0x28] = in_stack_fffffffffffff9a0[0x28];
  matcher.impl_.expected_._M_elems[0x29] = in_stack_fffffffffffff9a0[0x29];
  matcher.impl_.expected_._M_elems[0x2a] = in_stack_fffffffffffff9a0[0x2a];
  matcher.impl_.expected_._M_elems[0x2b] = in_stack_fffffffffffff9a0[0x2b];
  matcher.impl_.expected_._M_elems[0x2c] = in_stack_fffffffffffff9a0[0x2c];
  matcher.impl_.expected_._M_elems[0x2d] = in_stack_fffffffffffff9a0[0x2d];
  matcher.impl_.expected_._M_elems[0x2e] = in_stack_fffffffffffff9a0[0x2e];
  matcher.impl_.expected_._M_elems[0x2f] = in_stack_fffffffffffff9a0[0x2f];
  matcher.impl_.expected_._M_elems[0x30] = in_stack_fffffffffffff9a0[0x30];
  matcher.impl_.expected_._M_elems[0x31] = in_stack_fffffffffffff9a0[0x31];
  matcher.impl_.expected_._M_elems[0x32] = in_stack_fffffffffffff9a0[0x32];
  matcher.impl_.expected_._M_elems[0x33] = in_stack_fffffffffffff9a0[0x33];
  matcher.impl_.expected_._M_elems[0x34] = in_stack_fffffffffffff9a0[0x34];
  matcher.impl_.expected_._M_elems[0x35] = in_stack_fffffffffffff9a0[0x35];
  matcher.impl_.expected_._M_elems[0x36] = in_stack_fffffffffffff9a0[0x36];
  matcher.impl_.expected_._M_elems[0x37] = in_stack_fffffffffffff9a0[0x37];
  matcher.impl_.expected_._M_elems[0x38] = in_stack_fffffffffffff9a0[0x38];
  matcher.impl_.expected_._M_elems[0x39] = in_stack_fffffffffffff9a0[0x39];
  matcher.impl_.expected_._M_elems[0x3a] = in_stack_fffffffffffff9a0[0x3a];
  matcher.impl_.expected_._M_elems[0x3b] = in_stack_fffffffffffff9a0[0x3b];
  matcher.impl_.expected_._M_elems[0x3c] = in_stack_fffffffffffff9a0[0x3c];
  matcher.impl_.expected_._M_elems[0x3d] = in_stack_fffffffffffff9a0[0x3d];
  matcher.impl_.expected_._M_elems[0x3e] = in_stack_fffffffffffff9a0[0x3e];
  matcher.impl_.expected_._M_elems[0x3f] = in_stack_fffffffffffff9a0[0x3f];
  matcher.impl_.expected_._M_elems[0x40] = in_stack_fffffffffffff9a0[0x40];
  matcher.impl_.expected_._M_elems[0x41] = in_stack_fffffffffffff9a0[0x41];
  matcher.impl_.expected_._M_elems[0x42] = in_stack_fffffffffffff9a0[0x42];
  matcher.impl_.expected_._M_elems[0x43] = in_stack_fffffffffffff9a0[0x43];
  matcher.impl_.expected_._M_elems[0x44] = in_stack_fffffffffffff9a0[0x44];
  matcher.impl_.expected_._M_elems[0x45] = in_stack_fffffffffffff9a0[0x45];
  matcher.impl_.expected_._M_elems[0x46] = in_stack_fffffffffffff9a0[0x46];
  matcher.impl_.expected_._M_elems[0x47] = in_stack_fffffffffffff9a0[0x47];
  matcher.impl_.expected_._M_elems[0x48] = in_stack_fffffffffffff9a0[0x48];
  matcher.impl_.expected_._M_elems[0x49] = in_stack_fffffffffffff9a0[0x49];
  matcher.impl_.expected_._M_elems[0x4a] = in_stack_fffffffffffff9a0[0x4a];
  matcher.impl_.expected_._M_elems[0x4b] = in_stack_fffffffffffff9a0[0x4b];
  matcher.impl_.expected_._M_elems[0x4c] = in_stack_fffffffffffff9a0[0x4c];
  matcher.impl_.expected_._M_elems[0x4d] = in_stack_fffffffffffff9a0[0x4d];
  matcher.impl_.expected_._M_elems[0x4e] = in_stack_fffffffffffff9a0[0x4e];
  matcher.impl_.expected_._M_elems[0x4f] = in_stack_fffffffffffff9a0[0x4f];
  matcher.impl_.expected_._M_elems[0x50] = in_stack_fffffffffffff9a0[0x50];
  matcher.impl_.expected_._M_elems[0x51] = in_stack_fffffffffffff9a0[0x51];
  matcher.impl_.expected_._M_elems[0x52] = in_stack_fffffffffffff9a0[0x52];
  matcher.impl_.expected_._M_elems[0x53] = in_stack_fffffffffffff9a0[0x53];
  matcher.impl_.expected_._M_elems[0x54] = in_stack_fffffffffffff9a0[0x54];
  matcher.impl_.expected_._M_elems[0x55] = in_stack_fffffffffffff9a0[0x55];
  matcher.impl_.expected_._M_elems[0x56] = in_stack_fffffffffffff9a0[0x56];
  matcher.impl_.expected_._M_elems[0x57] = in_stack_fffffffffffff9a0[0x57];
  matcher.impl_.expected_._M_elems[0x58] = in_stack_fffffffffffff9a0[0x58];
  matcher.impl_.expected_._M_elems[0x59] = in_stack_fffffffffffff9a0[0x59];
  matcher.impl_.expected_._M_elems[0x5a] = in_stack_fffffffffffff9a0[0x5a];
  matcher.impl_.expected_._M_elems[0x5b] = in_stack_fffffffffffff9a0[0x5b];
  matcher.impl_.expected_._M_elems[0x5c] = in_stack_fffffffffffff9a0[0x5c];
  matcher.impl_.expected_._M_elems[0x5d] = in_stack_fffffffffffff9a0[0x5d];
  matcher.impl_.expected_._M_elems[0x5e] = in_stack_fffffffffffff9a0[0x5e];
  matcher.impl_.expected_._M_elems[0x5f] = in_stack_fffffffffffff9a0[0x5f];
  matcher.impl_.expected_._M_elems[0x60] = in_stack_fffffffffffff9a0[0x60];
  matcher.impl_.expected_._M_elems[0x61] = in_stack_fffffffffffff9a0[0x61];
  matcher.impl_.expected_._M_elems[0x62] = in_stack_fffffffffffff9a0[0x62];
  matcher.impl_.expected_._M_elems[99] = in_stack_fffffffffffff9a0[99];
  matcher.impl_.expected_._M_elems[100] = in_stack_fffffffffffff9a0[100];
  matcher.impl_.expected_._M_elems[0x65] = in_stack_fffffffffffff9a0[0x65];
  matcher.impl_.expected_._M_elems[0x66] = in_stack_fffffffffffff9a0[0x66];
  matcher.impl_.expected_._M_elems[0x67] = in_stack_fffffffffffff9a0[0x67];
  matcher.impl_.expected_._M_elems[0x68] = in_stack_fffffffffffff9a0[0x68];
  matcher.impl_.expected_._M_elems[0x69] = in_stack_fffffffffffff9a0[0x69];
  matcher.impl_.expected_._M_elems[0x6a] = in_stack_fffffffffffff9a0[0x6a];
  matcher.impl_.expected_._M_elems[0x6b] = in_stack_fffffffffffff9a0[0x6b];
  matcher.impl_.expected_._M_elems[0x6c] = in_stack_fffffffffffff9a0[0x6c];
  matcher.impl_.expected_._M_elems[0x6d] = in_stack_fffffffffffff9a0[0x6d];
  matcher.impl_.expected_._M_elems[0x6e] = in_stack_fffffffffffff9a0[0x6e];
  matcher.impl_.expected_._M_elems[0x6f] = in_stack_fffffffffffff9a0[0x6f];
  matcher.impl_.expected_._M_elems[0x70] = in_stack_fffffffffffff9a0[0x70];
  matcher.impl_.expected_._M_elems[0x71] = in_stack_fffffffffffff9a0[0x71];
  matcher.impl_.expected_._M_elems[0x72] = in_stack_fffffffffffff9a0[0x72];
  matcher.impl_.expected_._M_elems[0x73] = in_stack_fffffffffffff9a0[0x73];
  matcher.impl_.expected_._M_elems[0x74] = in_stack_fffffffffffff9a0[0x74];
  matcher.impl_.expected_._M_elems[0x75] = in_stack_fffffffffffff9a0[0x75];
  matcher.impl_.expected_._M_elems[0x76] = in_stack_fffffffffffff9a0[0x76];
  matcher.impl_.expected_._M_elems[0x77] = in_stack_fffffffffffff9a0[0x77];
  matcher.impl_.expected_._M_elems[0x78] = in_stack_fffffffffffff9a0[0x78];
  matcher.impl_.expected_._M_elems[0x79] = in_stack_fffffffffffff9a0[0x79];
  matcher.impl_.expected_._M_elems[0x7a] = in_stack_fffffffffffff9a0[0x7a];
  matcher.impl_.expected_._M_elems[0x7b] = in_stack_fffffffffffff9a0[0x7b];
  matcher.impl_.expected_._M_elems[0x7c] = in_stack_fffffffffffff9a0[0x7c];
  matcher.impl_.expected_._M_elems[0x7d] = in_stack_fffffffffffff9a0[0x7d];
  matcher.impl_.expected_._M_elems[0x7e] = in_stack_fffffffffffff9a0[0x7e];
  matcher.impl_.expected_._M_elems[0x7f] = in_stack_fffffffffffff9a0[0x7f];
  matcher.impl_.expected_._M_elems[0x80] = in_stack_fffffffffffff9a0[0x80];
  matcher.impl_.expected_._M_elems[0x81] = in_stack_fffffffffffff9a0[0x81];
  matcher.impl_.expected_._M_elems[0x82] = in_stack_fffffffffffff9a0[0x82];
  matcher.impl_.expected_._M_elems[0x83] = in_stack_fffffffffffff9a0[0x83];
  matcher.impl_.expected_._M_elems[0x84] = in_stack_fffffffffffff9a0[0x84];
  matcher.impl_.expected_._M_elems[0x85] = in_stack_fffffffffffff9a0[0x85];
  matcher.impl_.expected_._M_elems[0x86] = in_stack_fffffffffffff9a0[0x86];
  matcher.impl_.expected_._M_elems[0x87] = in_stack_fffffffffffff9a0[0x87];
  matcher.impl_.expected_._M_elems[0x88] = in_stack_fffffffffffff9a0[0x88];
  matcher.impl_.expected_._M_elems[0x89] = in_stack_fffffffffffff9a0[0x89];
  matcher.impl_.expected_._M_elems[0x8a] = in_stack_fffffffffffff9a0[0x8a];
  matcher.impl_.expected_._M_elems[0x8b] = in_stack_fffffffffffff9a0[0x8b];
  matcher.impl_.expected_._M_elems[0x8c] = in_stack_fffffffffffff9a0[0x8c];
  matcher.impl_.expected_._M_elems[0x8d] = in_stack_fffffffffffff9a0[0x8d];
  matcher.impl_.expected_._M_elems[0x8e] = in_stack_fffffffffffff9a0[0x8e];
  matcher.impl_.expected_._M_elems[0x8f] = in_stack_fffffffffffff9a0[0x8f];
  matcher.impl_.expected_._M_elems[0x90] = in_stack_fffffffffffff9a0[0x90];
  matcher.impl_.expected_._M_elems[0x91] = in_stack_fffffffffffff9a0[0x91];
  matcher.impl_.expected_._M_elems[0x92] = in_stack_fffffffffffff9a0[0x92];
  matcher.impl_.expected_._M_elems[0x93] = in_stack_fffffffffffff9a0[0x93];
  matcher.impl_.expected_._M_elems[0x94] = in_stack_fffffffffffff9a0[0x94];
  matcher.impl_.expected_._M_elems[0x95] = in_stack_fffffffffffff9a0[0x95];
  matcher.impl_.expected_._M_elems[0x96] = in_stack_fffffffffffff9a0[0x96];
  matcher.impl_.expected_._M_elems[0x97] = in_stack_fffffffffffff9a0[0x97];
  matcher.impl_.expected_._M_elems[0x98] = in_stack_fffffffffffff9a0[0x98];
  matcher.impl_.expected_._M_elems[0x99] = in_stack_fffffffffffff9a0[0x99];
  matcher.impl_.expected_._M_elems[0x9a] = in_stack_fffffffffffff9a0[0x9a];
  matcher.impl_.expected_._M_elems[0x9b] = in_stack_fffffffffffff9a0[0x9b];
  matcher.impl_.expected_._M_elems[0x9c] = in_stack_fffffffffffff9a0[0x9c];
  matcher.impl_.expected_._M_elems[0x9d] = in_stack_fffffffffffff9a0[0x9d];
  matcher.impl_.expected_._M_elems[0x9e] = in_stack_fffffffffffff9a0[0x9e];
  matcher.impl_.expected_._M_elems[0x9f] = in_stack_fffffffffffff9a0[0x9f];
  matcher.impl_.expected_._M_elems[0xa0] = in_stack_fffffffffffff9a0[0xa0];
  matcher.impl_.expected_._M_elems[0xa1] = in_stack_fffffffffffff9a0[0xa1];
  matcher.impl_.expected_._M_elems[0xa2] = in_stack_fffffffffffff9a0[0xa2];
  matcher.impl_.expected_._M_elems[0xa3] = in_stack_fffffffffffff9a0[0xa3];
  matcher.impl_.expected_._M_elems[0xa4] = in_stack_fffffffffffff9a0[0xa4];
  matcher.impl_.expected_._M_elems[0xa5] = in_stack_fffffffffffff9a0[0xa5];
  matcher.impl_.expected_._M_elems[0xa6] = in_stack_fffffffffffff9a0[0xa6];
  matcher.impl_.expected_._M_elems[0xa7] = in_stack_fffffffffffff9a0[0xa7];
  matcher.impl_.expected_._M_elems[0xa8] = in_stack_fffffffffffff9a0[0xa8];
  matcher.impl_.expected_._M_elems[0xa9] = in_stack_fffffffffffff9a0[0xa9];
  matcher.impl_.expected_._M_elems[0xaa] = in_stack_fffffffffffff9a0[0xaa];
  matcher.impl_.expected_._M_elems[0xab] = in_stack_fffffffffffff9a0[0xab];
  matcher.impl_.expected_._M_elems[0xac] = in_stack_fffffffffffff9a0[0xac];
  matcher.impl_.expected_._M_elems[0xad] = in_stack_fffffffffffff9a0[0xad];
  matcher.impl_.expected_._M_elems[0xae] = in_stack_fffffffffffff9a0[0xae];
  matcher.impl_.expected_._M_elems[0xaf] = in_stack_fffffffffffff9a0[0xaf];
  matcher.impl_.expected_._M_elems[0xb0] = in_stack_fffffffffffff9a0[0xb0];
  matcher.impl_.expected_._M_elems[0xb1] = in_stack_fffffffffffff9a0[0xb1];
  matcher.impl_.expected_._M_elems[0xb2] = in_stack_fffffffffffff9a0[0xb2];
  matcher.impl_.expected_._M_elems[0xb3] = in_stack_fffffffffffff9a0[0xb3];
  matcher.impl_.expected_._M_elems[0xb4] = in_stack_fffffffffffff9a0[0xb4];
  matcher.impl_.expected_._M_elems[0xb5] = in_stack_fffffffffffff9a0[0xb5];
  matcher.impl_.expected_._M_elems[0xb6] = in_stack_fffffffffffff9a0[0xb6];
  matcher.impl_.expected_._M_elems[0xb7] = in_stack_fffffffffffff9a0[0xb7];
  matcher.impl_.expected_._M_elems[0xb8] = in_stack_fffffffffffff9a0[0xb8];
  matcher.impl_.expected_._M_elems[0xb9] = in_stack_fffffffffffff9a0[0xb9];
  matcher.impl_.expected_._M_elems[0xba] = in_stack_fffffffffffff9a0[0xba];
  matcher.impl_.expected_._M_elems[0xbb] = in_stack_fffffffffffff9a0[0xbb];
  matcher.impl_.expected_._M_elems[0xbc] = in_stack_fffffffffffff9a0[0xbc];
  matcher.impl_.expected_._M_elems[0xbd] = in_stack_fffffffffffff9a0[0xbd];
  matcher.impl_.expected_._M_elems[0xbe] = in_stack_fffffffffffff9a0[0xbe];
  matcher.impl_.expected_._M_elems[0xbf] = in_stack_fffffffffffff9a0[0xbf];
  matcher.impl_.expected_._M_elems[0xc0] = in_stack_fffffffffffff9a0[0xc0];
  matcher.impl_.expected_._M_elems[0xc1] = in_stack_fffffffffffff9a0[0xc1];
  matcher.impl_.expected_._M_elems[0xc2] = in_stack_fffffffffffff9a0[0xc2];
  matcher.impl_.expected_._M_elems[0xc3] = in_stack_fffffffffffff9a0[0xc3];
  matcher.impl_.expected_._M_elems[0xc4] = in_stack_fffffffffffff9a0[0xc4];
  matcher.impl_.expected_._M_elems[0xc5] = in_stack_fffffffffffff9a0[0xc5];
  matcher.impl_.expected_._M_elems[0xc6] = in_stack_fffffffffffff9a0[0xc6];
  matcher.impl_.expected_._M_elems[199] = in_stack_fffffffffffff9a0[199];
  matcher.impl_.expected_._M_elems[200] = in_stack_fffffffffffff9a0[200];
  matcher.impl_.expected_._M_elems[0xc9] = in_stack_fffffffffffff9a0[0xc9];
  matcher.impl_.expected_._M_elems[0xca] = in_stack_fffffffffffff9a0[0xca];
  matcher.impl_.expected_._M_elems[0xcb] = in_stack_fffffffffffff9a0[0xcb];
  matcher.impl_.expected_._M_elems[0xcc] = in_stack_fffffffffffff9a0[0xcc];
  matcher.impl_.expected_._M_elems[0xcd] = in_stack_fffffffffffff9a0[0xcd];
  matcher.impl_.expected_._M_elems[0xce] = in_stack_fffffffffffff9a0[0xce];
  matcher.impl_.expected_._M_elems[0xcf] = in_stack_fffffffffffff9a0[0xcf];
  matcher.impl_.expected_._M_elems[0xd0] = in_stack_fffffffffffff9a0[0xd0];
  matcher.impl_.expected_._M_elems[0xd1] = in_stack_fffffffffffff9a0[0xd1];
  matcher.impl_.expected_._M_elems[0xd2] = in_stack_fffffffffffff9a0[0xd2];
  matcher.impl_.expected_._M_elems[0xd3] = in_stack_fffffffffffff9a0[0xd3];
  matcher.impl_.expected_._M_elems[0xd4] = in_stack_fffffffffffff9a0[0xd4];
  matcher.impl_.expected_._M_elems[0xd5] = in_stack_fffffffffffff9a0[0xd5];
  matcher.impl_.expected_._M_elems[0xd6] = in_stack_fffffffffffff9a0[0xd6];
  matcher.impl_.expected_._M_elems[0xd7] = in_stack_fffffffffffff9a0[0xd7];
  matcher.impl_.expected_._M_elems[0xd8] = in_stack_fffffffffffff9a0[0xd8];
  matcher.impl_.expected_._M_elems[0xd9] = in_stack_fffffffffffff9a0[0xd9];
  matcher.impl_.expected_._M_elems[0xda] = in_stack_fffffffffffff9a0[0xda];
  matcher.impl_.expected_._M_elems[0xdb] = in_stack_fffffffffffff9a0[0xdb];
  matcher.impl_.expected_._M_elems[0xdc] = in_stack_fffffffffffff9a0[0xdc];
  matcher.impl_.expected_._M_elems[0xdd] = in_stack_fffffffffffff9a0[0xdd];
  matcher.impl_.expected_._M_elems[0xde] = in_stack_fffffffffffff9a0[0xde];
  matcher.impl_.expected_._M_elems[0xdf] = in_stack_fffffffffffff9a0[0xdf];
  matcher.impl_.expected_._M_elems[0xe0] = in_stack_fffffffffffff9a0[0xe0];
  matcher.impl_.expected_._M_elems[0xe1] = in_stack_fffffffffffff9a0[0xe1];
  matcher.impl_.expected_._M_elems[0xe2] = in_stack_fffffffffffff9a0[0xe2];
  matcher.impl_.expected_._M_elems[0xe3] = in_stack_fffffffffffff9a0[0xe3];
  matcher.impl_.expected_._M_elems[0xe4] = in_stack_fffffffffffff9a0[0xe4];
  matcher.impl_.expected_._M_elems[0xe5] = in_stack_fffffffffffff9a0[0xe5];
  matcher.impl_.expected_._M_elems[0xe6] = in_stack_fffffffffffff9a0[0xe6];
  matcher.impl_.expected_._M_elems[0xe7] = in_stack_fffffffffffff9a0[0xe7];
  matcher.impl_.expected_._M_elems[0xec] = (char)in_stack_fffffffffffffa8c;
  matcher.impl_.expected_._M_elems[0xed] = (char)((uint)in_stack_fffffffffffffa8c >> 8);
  matcher.impl_.expected_._M_elems[0xee] = (char)((uint)in_stack_fffffffffffffa8c >> 0x10);
  matcher.impl_.expected_._M_elems[0xef] = (char)((uint)in_stack_fffffffffffffa8c >> 0x18);
  matcher.impl_.expected_._M_elems[0xf0] = (char)in_stack_fffffffffffffa90;
  matcher.impl_.expected_._M_elems[0xf1] = (char)((uint)in_stack_fffffffffffffa90 >> 8);
  matcher.impl_.expected_._M_elems[0xf2] = (char)((uint)in_stack_fffffffffffffa90 >> 0x10);
  matcher.impl_.expected_._M_elems[0xf3] = (char)((uint)in_stack_fffffffffffffa90 >> 0x18);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<char,244ul>>>>
            (matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<char,244ul>>>>
  ::operator()((AssertionResult *)local_2d8,local_3cc,(array<char,_244UL> *)"actual.payload");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
  if (!bVar1) {
    testing::Message::Message(&local_4c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_4d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/brokerface/test_message_type.cpp"
               ,0x38,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4d0,&local_4c8);
    testing::internal::AssertHelper::~AssertHelper(&local_4d0);
    testing::Message::~Message(&local_4c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
  return;
}

Assistant:

TEST (BrokerMessageType, EmptyString) {
    std::uint32_t const mid = 1234;
    std::uint16_t const part = 21;
    std::uint16_t const num_parts = 1234;

    pstore::brokerface::message_type const actual{mid, part, num_parts, ""};

    EXPECT_EQ (actual.sender_id, pstore::brokerface::message_type::process_id);
    EXPECT_EQ (actual.message_id, mid);
    EXPECT_EQ (actual.part_no, part);
    EXPECT_EQ (actual.num_parts, num_parts);

    pstore::brokerface::message_type::payload_type expected_payload{{'\0'}};
    EXPECT_THAT (actual.payload, ::testing::ContainerEq (expected_payload));
}